

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wversion_time(OutputFile *this)

{
  ostream *o;
  OutputFile *this_local;
  
  o = stream(this);
  output_version_time(o);
  return this;
}

Assistant:

OutputFile & OutputFile::wversion_time ()
{
	output_version_time (stream ());
	return *this;
}